

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

uint32 __thiscall userinfo_t::ColorChanged(userinfo_t *this,char *colorname)

{
  FBaseCVar *this_00;
  FBaseCVar **ppFVar1;
  FName local_20;
  FName local_1c;
  
  local_1c.Index = 0x204;
  ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,&local_1c);
  this_00 = *ppFVar1;
  if (this_00 != (FBaseCVar *)0x0) {
    FBaseCVar::SetGenericRep(this_00,(UCVarValue)colorname,CVAR_String);
    local_20.Index = 0x237;
    ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                        (&this->
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                         ,&local_20);
    FIntCVar::operator=((FIntCVar *)*ppFVar1,-1);
    return *(uint32 *)&this_00[1]._vptr_FBaseCVar;
  }
  __assert_fail("color != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/d_netinfo.cpp"
                ,0x1eb,"uint32 userinfo_t::ColorChanged(const char *)");
}

Assistant:

uint32 userinfo_t::ColorChanged(const char *colorname)
{
	FColorCVar *color = static_cast<FColorCVar *>((*this)[NAME_Color]);
	assert(color != NULL);
	UCVarValue val;
	val.String = const_cast<char *>(colorname);
	color->SetGenericRep(val, CVAR_String);
	*static_cast<FIntCVar *>((*this)[NAME_ColorSet]) = -1;
	return *color;
}